

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

void DLightTransfer::DoTransfer(int level,int target,bool floor)

{
  int iVar1;
  FSectorTagIterator local_28;
  FSectorTagIterator itr_1;
  FSectorTagIterator itr;
  int secnum;
  bool floor_local;
  int target_local;
  int level_local;
  
  if (floor) {
    FSectorTagIterator::FSectorTagIterator(&itr_1,target);
    while (iVar1 = FSectorTagIterator::Next(&itr_1), -1 < iVar1) {
      sector_t::SetPlaneLight((sector_t *)(sectors + iVar1),0,level);
    }
  }
  else {
    FSectorTagIterator::FSectorTagIterator(&local_28,target);
    while (iVar1 = FSectorTagIterator::Next(&local_28), -1 < iVar1) {
      sector_t::SetPlaneLight((sector_t *)(sectors + iVar1),1,level);
    }
  }
  return;
}

Assistant:

void DLightTransfer::DoTransfer (int level, int target, bool floor)
{
	int secnum;

	if (floor)
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].SetPlaneLight(sector_t::floor, level);
	}
	else
	{
		FSectorTagIterator itr(target);
		while ((secnum = itr.Next()) >= 0)
			sectors[secnum].SetPlaneLight(sector_t::ceiling, level);
	}
}